

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O1

pair<const_unsigned_short_*,_const_unsigned_short_*> __thiscall
frozen::
unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>::
equal_range<int>(unordered_set<unsigned_short,_3UL,_frozen::elsa<unsigned_short>,_std::equal_to<unsigned_short>_>
                 *this,int *key)

{
  unsigned_short *puVar1;
  size_t sVar2;
  long lVar3;
  unsigned_short *puVar4;
  pair<const_unsigned_short_*,_const_unsigned_short_*> pVar5;
  
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<unsigned_short>>::
          lookup<int,frozen::elsa<unsigned_short>>
                    ((pmh_tables<8ul,frozen::elsa<unsigned_short>> *)&this->tables_,key,
                     (elsa<unsigned_short> *)&this->tables_);
  if ((sVar2 == 3) || ((this->keys_).data_[sVar2] != (unsigned_short)*key)) {
    lVar3 = 6;
  }
  else {
    lVar3 = sVar2 * 2;
  }
  puVar4 = (unsigned_short *)((long)(this->keys_).data_ + lVar3 + 2);
  puVar1 = (unsigned_short *)((long)(this->keys_).data_ + lVar3);
  if (lVar3 == 6) {
    puVar4 = (unsigned_short *)&this->field_0x6;
    puVar1 = (unsigned_short *)&this->field_0x6;
  }
  pVar5.second = puVar4;
  pVar5.first = puVar1;
  return pVar5;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }